

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_domain(Impl *this)

{
  uint uVar1;
  Builder *this_00;
  MDOperand *md;
  MDNode *node;
  Function *entryPoint;
  LoggingCallback p_Var2;
  void *pvVar3;
  byte bVar4;
  char buffer [4096];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addCapability(this_00,CapabilityTessellation);
  md = get_shader_property_tag(this->entry_point_meta,DSState);
  if (md != (MDOperand *)0x0) {
    node = LLVMBC::cast<LLVMBC::MDNode>(md);
    uVar1 = get_constant_metadata<unsigned_int>(node,0);
    entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
    bVar4 = (char)uVar1 - 1;
    if (bVar4 < 3) {
      spv::Builder::addExecutionMode
                (this_00,entryPoint,*(ExecutionMode *)(&DAT_001a0620 + (ulong)bVar4 * 4),-1,-1,-1);
      uVar1 = get_constant_metadata<unsigned_int>(node,1);
      (this->execution_mode_meta).stage_input_num_vertex = uVar1;
      return true;
    }
    p_Var2 = get_thread_log_callback();
    if (p_Var2 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Unknown tessellator domain!\n",0x25,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(buffer + 0x10,"tor domain!\n",0xd);
      builtin_strncpy(buffer,"Unknown tessella",0x10);
      pvVar3 = get_thread_log_callback_userdata();
      (*p_Var2)(pvVar3,Error,buffer);
    }
  }
  return false;
}

Assistant:

bool Converter::Impl::emit_execution_modes_domain()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityTessellation);

	auto *ds_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::DSState);
	if (ds_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*ds_state_node);
		auto domain = static_cast<DXIL::TessellatorDomain>(get_constant_metadata(arguments, 0));
		auto *func = spirv_module.get_entry_function();

		switch (domain)
		{
		case DXIL::TessellatorDomain::IsoLine:
			builder.addExecutionMode(func, spv::ExecutionModeIsolines);
			break;

		case DXIL::TessellatorDomain::Tri:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			break;

		case DXIL::TessellatorDomain::Quad:
			builder.addExecutionMode(func, spv::ExecutionModeQuads);
			break;

		default:
			LOGE("Unknown tessellator domain!\n");
			return false;
		}

		unsigned input_control_points = get_constant_metadata(arguments, 1);
		execution_mode_meta.stage_input_num_vertex = input_control_points;
		return true;
	}
	else
		return false;
}